

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::closeBeamlet_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,pair<int,_int> coord,int aperture,bool lside)

{
  size_t *psVar1;
  double dVar2;
  int beam;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  pair<int,_int> pVar7;
  _List_node_base *p_Var8;
  long lVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_50;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  local_38 = coord;
  iVar6 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
          ::find(&(this->pos2beam)._M_t,&local_38);
  beam = *(int *)&iVar6._M_node[1]._M_parent;
  bVar4 = isActiveBeamlet(this,beam);
  if ((bVar4) && (bVar4 = isOpenBeamlet(this,beam,aperture), bVar4)) {
    pVar7 = Collimator::indexToPos(this->collimator,beam,this->angle);
    iVar5 = pVar7.first;
    lVar9 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    piVar10 = (int *)(lVar9 + (long)iVar5 * 8);
    lVar11 = (long)iVar5 * 8;
    iVar12 = pVar7.second;
    if (lside) {
      iVar13 = *piVar10;
      if (iVar13 <= iVar12) {
        iVar14 = -1;
        do {
          dVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[aperture];
          p_Var8 = (_List_node_base *)operator_new(0x20);
          *(int *)&p_Var8[1]._M_next = iVar13 + (beam - iVar12) + iVar14 + 1;
          p_Var8[1]._M_prev = (_List_node_base *)((ulong)dVar2 ^ 0x8000000000000000);
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar9 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar13 = *(int *)(lVar9 + lVar11);
          iVar14 = iVar14 + 1;
        } while (iVar14 < iVar12 - iVar13);
      }
      uVar3 = *(undefined8 *)(lVar9 + lVar11);
      (this->last_mem).first.first = aperture;
      (this->last_mem).first.second = iVar5;
      (this->last_mem).second.first = (int)uVar3;
      (this->last_mem).second.second = (int)((ulong)uVar3 >> 0x20);
      if (*(int *)(lVar9 + 4 + lVar11) == iVar12) {
        *(undefined8 *)(lVar9 + lVar11) = 0xffffffffffffffff;
      }
      else {
        *(int *)(lVar9 + lVar11) = iVar12 + 1;
      }
    }
    else {
      if (iVar12 <= piVar10[1]) {
        iVar13 = -1;
        do {
          dVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[aperture];
          p_Var8 = (_List_node_base *)operator_new(0x20);
          *(int *)&p_Var8[1]._M_next = beam + iVar13 + 1;
          p_Var8[1]._M_prev = (_List_node_base *)((ulong)dVar2 ^ 0x8000000000000000);
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar9 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar13 = iVar13 + 1;
        } while (iVar13 < *(int *)(lVar9 + 4 + lVar11) - iVar12);
        piVar10 = (int *)(lVar9 + lVar11);
      }
      uVar3 = *(undefined8 *)piVar10;
      (this->last_mem).first.first = aperture;
      (this->last_mem).first.second = iVar5;
      (this->last_mem).second.first = (int)uVar3;
      (this->last_mem).second.second = (int)((ulong)uVar3 >> 0x20);
      if (*piVar10 == iVar12) {
        piVar10[0] = -1;
        piVar10[1] = -1;
      }
      else {
        piVar10[1] = iVar12 + -1;
      }
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              (&local_50,__return_storage_ptr__);
    updateIntensity(this,&local_50);
    while (local_50.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50) {
      p_Var8 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &(local_50.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_50.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
      local_50.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = p_Var8;
    }
  }
  if (&this->last_diff != __return_storage_ptr__) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node.super__List_node_base._M_next,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list<pair <int,double> > Station::closeBeamlet(pair<int,int> coord, int aperture, bool lside) {
    
    list<pair <int, double> > diff;
    int beam = getBeamIndex(coord);

    //cout << "Attempt to close beam: " << beam << endl;
    //cout << "active: " << isActiveBeamlet(beam) << "open: " << isOpenBeamlet(beam, aperture) << endl;
    
    if (isActiveBeamlet(beam) && isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      if (lside) {
        for (int i=0; i<=coord.second-A[aperture][row].first; i++) {
          diff.push_back(make_pair(beam-(coord.second-A[aperture][row].first)+i, -intensity[aperture]));
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].second == coord.second) {
          A[aperture][row].first=-1;
          A[aperture][row].second=-1;
        } else {
          A[aperture][row].first=coord.second+1;
        }
      } else {
        for (int i=0;i<=A[aperture][row].second-coord.second;i++) {
          diff.push_back(make_pair(beam+i, -intensity[aperture]));
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].first == coord.second) {
          A[aperture][row].first=-1;
          A[aperture][row].second=-1;
        } else {
          A[aperture][row].second=coord.second-1;
        }
      }
      updateIntensity(diff);
    }

    last_diff=diff;
    return(diff);
  }